

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O3

bool __thiscall QNetworkCookieJar::deleteCookie(QNetworkCookieJar *this,QNetworkCookie *cookie)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QNetworkCookie *pQVar4;
  long lVar5;
  const_iterator abegin;
  long lVar6;
  QNetworkCookie *this_00;
  
  lVar1 = *(long *)(this + 8);
  pQVar4 = *(QNetworkCookie **)(lVar1 + 0x80);
  lVar2 = *(long *)(lVar1 + 0x88);
  lVar5 = lVar2;
  this_00 = pQVar4;
  if (0 < lVar2 >> 2) {
    lVar6 = (lVar2 >> 2) + 1;
    lVar5 = lVar2 * 8;
    do {
      bVar3 = QNetworkCookie::hasSameIdentifier(this_00,cookie);
      abegin.i = this_00;
      if (bVar3) goto LAB_0018b06e;
      bVar3 = QNetworkCookie::hasSameIdentifier(this_00 + 1,cookie);
      abegin.i = this_00 + 1;
      if (bVar3) goto LAB_0018b06e;
      bVar3 = QNetworkCookie::hasSameIdentifier(this_00 + 2,cookie);
      abegin.i = this_00 + 2;
      if (bVar3) goto LAB_0018b06e;
      bVar3 = QNetworkCookie::hasSameIdentifier(this_00 + 3,cookie);
      abegin.i = this_00 + 3;
      if (bVar3) goto LAB_0018b06e;
      this_00 = this_00 + 4;
      lVar6 = lVar6 + -1;
      lVar5 = lVar5 + -0x20;
    } while (1 < lVar6);
    lVar5 = lVar5 >> 3;
  }
  if (lVar5 != 1) {
    abegin.i = this_00;
    if (lVar5 != 2) {
      abegin.i = pQVar4 + lVar2;
      if ((lVar5 != 3) ||
         (bVar3 = QNetworkCookie::hasSameIdentifier(this_00,cookie), abegin.i = this_00, bVar3))
      goto LAB_0018b06e;
      abegin.i = this_00 + 1;
    }
    bVar3 = QNetworkCookie::hasSameIdentifier(abegin.i,cookie);
    if (bVar3) goto LAB_0018b06e;
    this_00 = abegin.i + 1;
  }
  bVar3 = QNetworkCookie::hasSameIdentifier(this_00,cookie);
  abegin.i = pQVar4 + lVar2;
  if (bVar3) {
    abegin.i = this_00;
  }
LAB_0018b06e:
  pQVar4 = (QNetworkCookie *)(*(long *)(lVar1 + 0x88) * 8 + *(long *)(lVar1 + 0x80));
  if (abegin.i != pQVar4) {
    QList<QNetworkCookie>::erase((QList<QNetworkCookie> *)(lVar1 + 0x78),abegin,abegin.i + 1);
  }
  return abegin.i != pQVar4;
}

Assistant:

bool QNetworkCookieJar::deleteCookie(const QNetworkCookie &cookie)
{
    Q_D(QNetworkCookieJar);
    const auto it = std::find_if(d->allCookies.cbegin(), d->allCookies.cend(),
                                 [&cookie](const auto &c) { return c.hasSameIdentifier(cookie); });
    if (it != d->allCookies.cend()) {
        d->allCookies.erase(it);
        return true;
    }
    return false;
}